

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrGetViewConfigurationProperties
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   XrViewConfigurationProperties *configurationProperties)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_3c;
  LoaderInstance *pLStack_38;
  XrResult result;
  LoaderInstance *loader_instance;
  XrViewConfigurationProperties *configurationProperties_local;
  XrSystemId XStack_20;
  XrViewConfigurationType viewConfigurationType_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)configurationProperties;
  configurationProperties_local._4_4_ = viewConfigurationType;
  XStack_20 = systemId;
  systemId_local = (XrSystemId)instance;
  local_3c = ActiveLoaderInstance::Get(&stack0xffffffffffffffc8,"xrGetViewConfigurationProperties");
  if (XR_ERROR_VALIDATION_FAILURE < local_3c) {
    this = LoaderInstance::DispatchTable(pLStack_38);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_3c = (*pXVar1->GetViewConfigurationProperties)
                         ((XrInstance)systemId_local,XStack_20,configurationProperties_local._4_4_,
                          (XrViewConfigurationProperties *)loader_instance);
  }
  return local_3c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetViewConfigurationProperties(
    XrInstance                                  instance,
    XrSystemId                                  systemId,
    XrViewConfigurationType                     viewConfigurationType,
    XrViewConfigurationProperties*              configurationProperties) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetViewConfigurationProperties");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetViewConfigurationProperties(instance, systemId, viewConfigurationType, configurationProperties);
    }
    return result;
}